

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O2

void __thiscall WebServer::start(WebServer *this)

{
  element_type *peVar1;
  EventLoop *this_00;
  LogStream *this_01;
  WebServer *pWVar2;
  undefined1 local_1038 [4056];
  function<void_()> local_60;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> local_40;
  allocator local_29;
  
  EventLoopThreadPool::start
            ((this->reactorPool_)._M_t.
             super___uniq_ptr_impl<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>.
             _M_t.
             super__Tuple_impl<0UL,_EventLoopThreadPool_*,_std::default_delete<EventLoopThreadPool>_>
             .super__Head_base<0UL,_EventLoopThreadPool_*,_false>._M_head_impl);
  HttpConnPool::start(&this->connPool_);
  ignoreSigpipe();
  peVar1 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1038._0_8_ = connectionCallback;
  local_1038._8_8_ = 0;
  local_1038._16_8_ = this;
  std::function<void()>::function<std::_Bind<void(WebServer::*(WebServer*))()>,void>
            ((function<void()> *)&local_60,(_Bind<void_(WebServer::*(WebServer_*))()> *)local_1038);
  std::function<void_()>::operator=(&peVar1->readCallback_,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  ((this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->events_ =
       -0x7fffffff;
  this_00 = this->loop_;
  std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             &(this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>);
  EventLoop::addChannel(this_00,(ChannelPtr *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pWVar2 = (WebServer *)local_1038;
  std::__cxx11::string::string((string *)pWVar2,"/index.html",&local_29);
  cachePage(pWVar2,(string *)local_1038);
  std::__cxx11::string::~string((string *)local_1038);
  pWVar2 = (WebServer *)local_1038;
  std::__cxx11::string::string((string *)pWVar2,"/404.html",&local_29);
  cachePage(pWVar2,(string *)local_1038);
  std::__cxx11::string::~string((string *)local_1038);
  pWVar2 = (WebServer *)local_1038;
  std::__cxx11::string::string((string *)pWVar2,"/400.html",&local_29);
  cachePage(pWVar2,(string *)local_1038);
  std::__cxx11::string::~string((string *)local_1038);
  pWVar2 = (WebServer *)local_1038;
  std::__cxx11::string::string((string *)pWVar2,"/403.html",&local_29);
  cachePage(pWVar2,(string *)local_1038);
  std::__cxx11::string::~string((string *)local_1038);
  this->started_ = true;
  Logger::Logger((Logger *)local_1038,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/WebServer.cpp"
                 ,0x51);
  this_01 = LogStream::operator<<((LogStream *)local_1038,"WebServer started on port ");
  LogStream::operator<<(this_01,this->port_);
  Logger::~Logger((Logger *)local_1038);
  return;
}

Assistant:

void WebServer::start() {
    reactorPool_->start();
    connPool_.start();
    ignoreSigpipe();    
    acceptChannel_->setReadCallback(std::bind(&WebServer::connectionCallback, this));
    acceptChannel_->setEvent(EPOLLIN | EPOLLET);
    loop_->addChannel(acceptChannel_);
    cachePage("/index.html");
    cachePage("/404.html");
    cachePage("/400.html");
    cachePage("/403.html");
    started_ = true;
    LOG << "WebServer started on port " <<port_;
}